

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper::RunImpl
          (sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper *this)

{
  TestResults *this_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  Message sentLogon;
  Logon local_2c0;
  Message local_168 [344];
  
  (this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_date = 0x257e44;
  (this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time =
       0x1aa324d61000;
  (this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_date = 0x268636;
  (this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time =
       0x354649ac2000;
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.field_0xc
       = *(undefined8 *)
          &(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time
        + 4);
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.field_0xc =
       *(undefined8 *)
        &(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time +
        4);
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0,0x1f);
  *(undefined4 *)((this->super_sessionFixture).object + 0x268) = 0;
  FIX::DateTime::nowUtc();
  createLogon(&local_2c0,"TW","ISLD",1);
  FIX::Message::Message(local_168,(Message *)&local_2c0);
  FIX::Message::~Message((Message *)&local_2c0);
  FIX::Session::send((Message *)(this->super_sessionFixture).object);
  FIX::Session::next();
  FIX::Session::next();
  if ((this->super_sessionFixture).object[0x263] == (Session)0x1) {
    ppTVar1 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar1;
    ppTVar2 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&local_2c0,*ppTVar2,0x741);
    UnitTest::TestResults::OnTestFailure(this_00,(TestDetails *)&local_2c0,"!object->sentLogon()");
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, LogOn_TimeoutWaitingForLogOnResponse) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);
  object->setLogonTimeout(0);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->next();

  CHECK(!object->sentLogon());
}